

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

int __thiscall
notch::core::ActivationLayer::clone
          (ActivationLayer *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  ActivationLayer *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  this_local = this;
  makeClone((ActivationLayer *)&stack0xffffffffffffffd8);
  ::std::shared_ptr<notch::core::ABackpropLayer>::shared_ptr<notch::core::ActivationLayer,void>
            ((shared_ptr<notch::core::ABackpropLayer> *)this,
             (shared_ptr<notch::core::ActivationLayer> *)&stack0xffffffffffffffd8);
  std::shared_ptr<notch::core::ActivationLayer>::~shared_ptr
            ((shared_ptr<notch::core::ActivationLayer> *)&stack0xffffffffffffffd8);
  return (int)this;
}

Assistant:

virtual std::shared_ptr<ABackpropLayer> clone() const { return makeClone(); }